

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type_demotion.c
# Opt level: O3

value value_type_demotion_boolean(value v,type_id id)

{
  type_id id_00;
  int iVar1;
  size_t sVar2;
  value v_00;
  long lVar3;
  bool bVar4;
  bool bVar5;
  anon_union_8_3_4e909c24 buffer;
  double local_20;
  
  local_20 = 0.0;
  id_00 = value_type_id(v);
  iVar1 = type_id_integer(id_00);
  if (((iVar1 == 0) || (iVar1 = type_id_decimal(id_00), iVar1 == 0)) &&
     (iVar1 = type_id_boolean(id), iVar1 == 0)) {
    if (id_00 != id) {
      sVar2 = value_type_id_size(id_00);
      value_to(v,&local_20,sVar2);
      sVar2 = value_type_id_size(id);
      v_00 = value_type_create((void *)0x0,sVar2,id);
      if (v_00 != (value)0x0) {
        value_destroy(v);
        iVar1 = type_id_decimal(id_00);
        v = v_00;
        if (iVar1 == 0) {
          if (id_00 == 6) {
            bVar4 = NAN(local_20);
            bVar5 = local_20 == 0.0;
          }
          else {
            if (id_00 != 5) {
              return v_00;
            }
            bVar4 = NAN(local_20._0_4_);
            bVar5 = local_20._0_4_ == 0.0;
          }
          if ((!bVar5) || (bVar4)) {
LAB_0010aba0:
            v = value_from_bool(v_00,'\x01');
          }
        }
        else {
          lVar3 = 0;
          do {
            if (*(char *)((long)&local_20 + lVar3) != '\0') goto LAB_0010aba0;
            lVar3 = lVar3 + 1;
          } while (lVar3 != 8);
        }
      }
    }
  }
  else {
    v = (value)0x0;
  }
  return v;
}

Assistant:

value value_type_demotion_boolean(value v, type_id id)
{
	union
	{
		char b[8];
		float f;
		double d;
	} buffer = {
		{ 0 }
	};

	value demotion = NULL;

	type_id v_id = value_type_id(v);

	if (!(type_id_integer(v_id) == 0 || type_id_decimal(v_id) == 0) || type_id_boolean(id) != 0)
	{
		return NULL;
	}

	if (v_id == id)
	{
		return v;
	}

	value_to(v, (void *)&buffer.b[0], value_type_id_size(v_id));

	demotion = value_type_create(NULL, value_type_id_size(id), id);

	if (demotion == NULL)
	{
		return v;
	}

	value_destroy(v);

	if (type_id_decimal(v_id) == 0)
	{
		if (v_id == TYPE_FLOAT)
		{
			if (buffer.f != 0.0f && buffer.f != -0.0f)
			{
				return value_from_bool(demotion, 1L);
			}
		}
		else if (v_id == TYPE_DOUBLE)
		{
			if (buffer.d != 0.0 && buffer.d != -0.0)
			{
				return value_from_bool(demotion, 1L);
			}
		}
		else
		{
			/* error */
		}
	}
	else
	{
		size_t iterator;

		for (iterator = 0; iterator < 8; ++iterator)
		{
			if (buffer.b[iterator] != 0x00)
			{
				return value_from_bool(demotion, 1L);
			}
		}
	}

	return demotion;
}